

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_InIntSet_Test::~TApp_InIntSet_Test(TApp_InIntSet_Test *this)

{
  TApp_InIntSet_Test *this_local;
  
  ~TApp_InIntSet_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, InIntSet) {

    int choice;
    app.add_set("-q,--quick", choice, {1, 2, 3});

    args = {"--quick", "2"};

    run();
    EXPECT_EQ(2, choice);

    app.reset();

    args = {"--quick", "4"};
    EXPECT_THROW(run(), CLI::ConversionError);
}